

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chromaclique.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  locale *this;
  bool bVar1;
  _Hashtable<int,std::pair<int_const,double>,std::allocator<std::pair<int_const,double>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  _Var2;
  Kind KVar3;
  _Rb_tree_color _Var4;
  pointer pbVar5;
  _Elt_pointer ppAVar6;
  AlignmentRecord *this_00;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  pointer *ppbVar11;
  _Base_ptr *pp_Var12;
  vector<mean_and_stddev_t,_std::allocator<mean_and_stddev_t>_> *pvVar13;
  _Base_ptr p_Var14;
  undefined1 *puVar15;
  char cVar16;
  bool bVar17;
  int iVar18;
  uint maxPosition;
  ostream *poVar19;
  _Rb_tree_node_base *p_Var20;
  mapped_type *pmVar21;
  int *piVar22;
  long lVar23;
  istream *piVar24;
  ctype *pcVar25;
  mapped_type *pmVar26;
  clock_t cVar27;
  NoMeEdgeCalculator *pNVar28;
  GaussianEdgeCalculator *this_01;
  LogWriter *pLVar29;
  _Elt_pointer ppAVar30;
  long *plVar31;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var32;
  iterator iVar33;
  mapped_type *pmVar34;
  size_type sVar35;
  undefined8 uVar36;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar37;
  long *plVar38;
  size_type *psVar39;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar40;
  _Base_ptr p_Var41;
  undefined1 *puVar42;
  _Elt_pointer ppAVar43;
  ulong uVar44;
  key_type *pkVar45;
  _Base_ptr p_Var46;
  _Base_ptr p_Var47;
  undefined1 *puVar48;
  undefined1 *puVar49;
  AlignmentRecord **r;
  undefined1 auVar50 [8];
  _Map_pointer pppAVar51;
  int iVar52;
  size_type sVar53;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar54;
  deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_> *__range1;
  string bamfile;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> s_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  consistingReads_1;
  int nonEdgeCounter;
  int edgecounter;
  string outfile;
  uint maxPosition1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
  args;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> trueReadsSupportMap;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  trueReadsUniqueSupportMap;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  readCountMap;
  string mean_and_sd_filename;
  string reference_path;
  string logfile;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  originalReadNames;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> errorReadsSupportMap;
  ofstream os;
  string indel_output_file;
  string allel_frequencies_path;
  RefVector references;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  errorReadsUniqueSupportMap;
  string indel_edge_cutoff;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  appearanceMap;
  CliqueCollector collector;
  unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
  simpson_map;
  string ia_line;
  unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
  switchRateRS;
  unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
  switchRateFS;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  insertion_words;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  words;
  ofstream osSupportTrue;
  SamHeader header;
  _Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_> *local_1110;
  undefined1 *local_1100;
  long local_10f8;
  undefined1 local_10f0 [23];
  char local_10d9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_10d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_10d0;
  key_type local_10c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_10a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_10a0;
  int local_1080;
  int local_107c;
  undefined1 *local_1078;
  long local_1070;
  undefined1 local_1068 [16];
  _Map_pointer local_1058;
  LogWriter *local_1050;
  uint local_1044;
  long *local_1040;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
  local_1038;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_1008;
  undefined1 local_fd8 [32];
  _Base_ptr local_fb8;
  size_t local_fb0;
  double local_fa8;
  vector<mean_and_stddev_t,_std::allocator<mean_and_stddev_t>_> *local_fa0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  local_f98;
  long local_f68;
  long local_f60;
  string local_f58;
  sp_counted_base *local_f38;
  long local_f30;
  sp_counted_base local_f28;
  undefined1 *local_f18;
  long local_f10;
  undefined1 local_f08 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_ef8;
  long *local_ee0;
  undefined1 local_ed8 [8];
  _Base_ptr local_ed0;
  _Base_ptr local_ec8;
  _Base_ptr local_ec0;
  size_t local_eb8;
  undefined1 local_eb0 [8];
  size_type local_ea8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ea0;
  undefined1 local_e90 [8];
  undefined1 local_e88 [208];
  ios_base local_db8 [272];
  char *local_ca8;
  LogWriter *local_ca0;
  char local_c98 [16];
  char *local_c88;
  long local_c80;
  char local_c78 [16];
  RefVector local_c68;
  NoMeEdgeCalculator *local_c50;
  clock_t local_c48;
  map<unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  *local_c40;
  map<unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  *local_c38;
  undefined1 local_c30 [16];
  _Base_ptr local_c20;
  _Base_ptr local_c18;
  _Base_ptr local_c10;
  size_t local_c08;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c00;
  undefined8 local_bf8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_bf0;
  anon_union_16_2_ba345be5_for_m_Storage local_be0;
  ulong local_bd0;
  anon_union_16_2_ba345be5_for_m_Storage local_bc8;
  ulong local_bb8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  local_bb0;
  CliqueCollector local_b80;
  string local_b60;
  string local_b40;
  string local_b20;
  string local_b00;
  string local_ae0;
  string local_ac0;
  _Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_aa0;
  undefined1 local_a68 [8];
  size_type local_a60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a58 [14];
  ios_base local_970 [264];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_868;
  undefined8 local_858;
  size_type local_850;
  _Prime_rehash_policy local_848;
  undefined8 local_838;
  _Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_830;
  _Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_7f8;
  _Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_7c0;
  undefined1 local_788 [8];
  pointer pbStack_780;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_778 [7];
  ios_base aiStack_690 [264];
  undefined1 local_588 [8];
  pointer pbStack_580;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_578 [14];
  ios_base aiStack_490 [264];
  undefined1 local_388 [8];
  char *local_380;
  long local_378;
  long lStack_370;
  ios_base aiStack_290 [264];
  undefined2 local_188 [4];
  locale local_180 [336];
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"in main",7);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
  std::ostream::put(-0x68);
  std::ostream::flush();
  local_eb0 = (undefined1  [8])&local_ea0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_eb0,
             "ChromaClique predicts nucleosome patterns NOMe-sequencing reads.\n\nUsage:\n  chromaclique [options] [--] <bamfile> [<output>]\nOptions:\n  -i NUM --iterations=NUM                  Number of iterations.\n                                           chromaclique will stop if the\n                                           superreads converge.\n                                           [default: -1]\n  -n --no_singletons                       Filter out single read cliques\n                                           after first iteration.\n  -L FILE --log=FILE                       Write log to <file>.\n  -bam --bam                               Option to create BAM File from output. <output> is used as prefix.\n  -nome --nome                             Option for NoMe Mode\n  -nP NUM --nomeParam=NUM                  Number of similar GC regions required for merging reads\n  -minOv NUM --minOverlap=NUM              minimum number of GC allowed in the overlapping regions\n  -R FILE --ref=FILE                       Reference File\n  -R FILE --FS=FILE                        Switch rates for the Forward strand\n  -R FILE --RS=FILE                        Switch rates for the Reverse strand\n  -unique NUM --uniqueSupportFilter=NUM    Filtering based on the specified number of unique support for each clique\n  -analysisFiles --analysisFiles           Option For creating analysis Files\n\n\n"
             ,"");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::vector<char**,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_588,argv + 1
             ,argv + argc,(allocator_type *)local_788);
  local_a60 = 0;
  local_a58[0]._M_local_buf[0] = '\0';
  local_a68 = (undefined1  [8])local_a58;
  docopt::docopt((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                  *)&local_1038,(string *)local_eb0,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_588,false,(string *)local_a68,false);
  if (local_a68 != (undefined1  [8])local_a58) {
    operator_delete((void *)local_a68);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_588);
  if (local_eb0 != (undefined1  [8])&local_ea0) {
    operator_delete((void *)local_eb0);
  }
  for (p_Var20 = local_1038._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var20 != &local_1038._M_impl.super__Rb_tree_header;
      p_Var20 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var20)) {
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>
    ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>
            *)local_eb0,
           (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>
            *)(p_Var20 + 1));
    poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,(char *)local_eb0,local_ea8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar19," ",1);
    poVar19 = docopt::operator<<(poVar19,(value *)local_e90);
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,"\n",1);
    if (local_e90._0_4_ == StringList) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_e88);
    }
    else if ((local_e90._0_4_ == String) &&
            ((pointer)local_e88._0_8_ != (pointer)(local_e88 + 0x10))) {
      operator_delete((void *)local_e88._0_8_);
    }
    if (local_eb0 != (undefined1  [8])&local_ea0) {
      operator_delete((void *)local_eb0);
    }
  }
  local_eb0 = (undefined1  [8])&local_ea0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_eb0,"<bamfile>","");
  pmVar21 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                          *)&local_1038,(key_type *)local_eb0);
  docopt::value::throwIfNotKind(pmVar21,String);
  local_1100 = local_10f0;
  pbVar5 = (pmVar21->variant).strList.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1100,pbVar5,
             (long)&(((pmVar21->variant).strList.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus)._M_p + (long)pbVar5)
  ;
  if (local_eb0 != (undefined1  [8])&local_ea0) {
    operator_delete((void *)local_eb0);
  }
  local_1078 = local_1068;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1078,"chromatypes.fasta","");
  local_eb0 = (undefined1  [8])&local_ea0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_eb0,"<output>","");
  pmVar21 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                          *)&local_1038,(key_type *)local_eb0);
  KVar3 = pmVar21->kind;
  if (local_eb0 != (undefined1  [8])&local_ea0) {
    operator_delete((void *)local_eb0);
  }
  if (KVar3 != Empty) {
    local_eb0 = (undefined1  [8])&local_ea0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_eb0,"<output>","");
    pmVar21 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                            *)&local_1038,(key_type *)local_eb0);
    docopt::value::throwIfNotKind(pmVar21,String);
    std::__cxx11::string::_M_assign((string *)&local_1078);
    if (local_eb0 != (undefined1  [8])&local_ea0) {
      operator_delete((void *)local_eb0);
    }
  }
  local_c88 = local_c78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c88,"");
  local_eb0 = (undefined1  [8])&local_ea0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_eb0,"--allel_frequencies","");
  pmVar21 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                          *)&local_1038,(key_type *)local_eb0);
  KVar3 = pmVar21->kind;
  if (local_eb0 != (undefined1  [8])&local_ea0) {
    operator_delete((void *)local_eb0);
  }
  if (KVar3 != Empty) {
    local_eb0 = (undefined1  [8])&local_ea0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_eb0,"--allel_frequencies","");
    pmVar21 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                            *)&local_1038,(key_type *)local_eb0);
    docopt::value::throwIfNotKind(pmVar21,String);
    std::__cxx11::string::_M_assign((string *)&local_c88);
    if (local_eb0 != (undefined1  [8])&local_ea0) {
      operator_delete((void *)local_eb0);
    }
  }
  local_f58._M_dataplus._M_p = (pointer)&local_f58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f58,"");
  local_eb0 = (undefined1  [8])&local_ea0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_eb0,"--mean_and_sd_filename","");
  pmVar21 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                          *)&local_1038,(key_type *)local_eb0);
  KVar3 = pmVar21->kind;
  if (local_eb0 != (undefined1  [8])&local_ea0) {
    operator_delete((void *)local_eb0);
  }
  if (KVar3 != Empty) {
    local_eb0 = (undefined1  [8])&local_ea0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_eb0,"--mean_and_sd_filename","")
    ;
    pmVar21 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                            *)&local_1038,(key_type *)local_eb0);
    docopt::value::throwIfNotKind(pmVar21,String);
    std::__cxx11::string::_M_assign((string *)&local_f58);
    if (local_eb0 != (undefined1  [8])&local_ea0) {
      operator_delete((void *)local_eb0);
    }
  }
  local_c00 = &local_bf0;
  local_bf8 = 0;
  local_bf0._M_local_buf[0] = '\0';
  local_ca8 = local_c98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_ca8,"");
  local_eb0 = (undefined1  [8])&local_ea0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_eb0,"--call_indels","");
  pmVar21 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                          *)&local_1038,(key_type *)local_eb0);
  KVar3 = pmVar21->kind;
  if (local_eb0 != (undefined1  [8])&local_ea0) {
    operator_delete((void *)local_eb0);
  }
  if (KVar3 != Empty) {
    local_eb0 = (undefined1  [8])&local_ea0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_eb0,"--call_indels","");
    pmVar21 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                            *)&local_1038,(key_type *)local_eb0);
    docopt::value::throwIfNotKind(pmVar21,String);
    std::__cxx11::string::_M_assign((string *)&local_ca8);
    if (local_eb0 != (undefined1  [8])&local_ea0) {
      operator_delete((void *)local_eb0);
    }
  }
  local_eb0 = (undefined1  [8])&local_ea0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_eb0,"--iterations","");
  pmVar21 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                          *)&local_1038,(key_type *)local_eb0);
  docopt::value::throwIfNotKind(pmVar21,String);
  paVar40 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pmVar21->variant).strList.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
  piVar22 = __errno_location();
  iVar18 = *piVar22;
  *piVar22 = 0;
  lVar23 = strtol(paVar40->_M_local_buf,(char **)local_a68,10);
  if (local_a68 == (undefined1  [8])paVar40) {
    std::__throw_invalid_argument("stoi");
LAB_00144ab0:
    std::__throw_out_of_range("stoi");
LAB_00144abc:
    std::__throw_invalid_argument("stod");
LAB_00144ac8:
    std::__throw_invalid_argument("stod");
LAB_00144ad4:
    std::__throw_invalid_argument("stod");
  }
  else {
    if (((int)lVar23 != lVar23) || (*piVar22 == 0x22)) goto LAB_00144ab0;
    if (*piVar22 == 0) {
      *piVar22 = iVar18;
    }
    if (local_eb0 != (undefined1  [8])&local_ea0) {
      operator_delete((void *)local_eb0);
    }
    local_eb0 = (undefined1  [8])&local_ea0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_eb0,"--no_singletons","");
    pmVar21 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                            *)&local_1038,(key_type *)local_eb0);
    docopt::value::throwIfNotKind(pmVar21,Bool);
    local_10a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)CONCAT71(local_10a8._1_7_,(pmVar21->variant).boolValue);
    if (local_eb0 != (undefined1  [8])&local_ea0) {
      operator_delete((void *)local_eb0);
    }
    local_f18 = local_f08;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f18,"");
    local_eb0 = (undefined1  [8])&local_ea0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_eb0,"--log","");
    pmVar21 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                            *)&local_1038,(key_type *)local_eb0);
    KVar3 = pmVar21->kind;
    if (local_eb0 != (undefined1  [8])&local_ea0) {
      operator_delete((void *)local_eb0);
    }
    if (KVar3 != Empty) {
      local_eb0 = (undefined1  [8])&local_ea0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_eb0,"--log","");
      pmVar21 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                              *)&local_1038,(key_type *)local_eb0);
      docopt::value::throwIfNotKind(pmVar21,String);
      std::__cxx11::string::_M_assign((string *)&local_f18);
      if (local_eb0 != (undefined1  [8])&local_ea0) {
        operator_delete((void *)local_eb0);
      }
    }
    local_eb0 = (undefined1  [8])&local_ea0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_eb0,"--doc_haplotypes","");
    pmVar21 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                            *)&local_1038,(key_type *)local_eb0);
    KVar3 = pmVar21->kind;
    if (local_eb0 != (undefined1  [8])&local_ea0) {
      operator_delete((void *)local_eb0);
    }
    local_f60 = lVar23;
    if (KVar3 == Empty) {
      local_f68 = 0;
LAB_001422cc:
      local_eb0 = (undefined1  [8])&local_ea0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_eb0,"--bam","");
      pmVar21 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                              *)&local_1038,(key_type *)local_eb0);
      docopt::value::throwIfNotKind(pmVar21,Bool);
      local_10d9 = (pmVar21->variant).boolValue;
      if (local_eb0 != (undefined1  [8])&local_ea0) {
        operator_delete((void *)local_eb0);
      }
      local_eb0 = (undefined1  [8])&local_ea0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_eb0,"--analysisFiles","");
      pmVar21 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                              *)&local_1038,(key_type *)local_eb0);
      docopt::value::throwIfNotKind(pmVar21,Bool);
      bVar1 = (pmVar21->variant).boolValue;
      if (local_eb0 != (undefined1  [8])&local_ea0) {
        operator_delete((void *)local_eb0);
      }
      local_eb0 = (undefined1  [8])&local_ea0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_eb0,"--nome","");
      pmVar21 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                              *)&local_1038,(key_type *)local_eb0);
      docopt::value::throwIfNotKind(pmVar21,Bool);
      local_10d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)CONCAT71(local_10d0._1_7_,(pmVar21->variant).boolValue);
      if (local_eb0 != (undefined1  [8])&local_ea0) {
        operator_delete((void *)local_eb0);
      }
      local_eb0 = (undefined1  [8])&local_ea0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_eb0,"--nomeParam","");
      pmVar21 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                              *)&local_1038,(key_type *)local_eb0);
      docopt::value::throwIfNotKind(pmVar21,String);
      paVar40 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(pmVar21->variant).strList.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      iVar18 = *piVar22;
      *piVar22 = 0;
      paVar54 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)strtod(paVar40->_M_local_buf,(char **)local_a68);
      if (local_a68 == (undefined1  [8])paVar40) goto LAB_00144abc;
      local_10d8 = paVar54;
      if (*piVar22 == 0) {
LAB_0014246b:
        *piVar22 = iVar18;
      }
      else if (*piVar22 == 0x22) {
        std::__throw_out_of_range("stod");
        goto LAB_0014246b;
      }
      if (local_eb0 != (undefined1  [8])&local_ea0) {
        operator_delete((void *)local_eb0);
      }
      local_eb0 = (undefined1  [8])&local_ea0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_eb0,"--uniqueSupportFilter","");
      pmVar21 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                              *)&local_1038,(key_type *)local_eb0);
      docopt::value::throwIfNotKind(pmVar21,String);
      paVar40 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(pmVar21->variant).strList.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      iVar18 = *piVar22;
      *piVar22 = 0;
      local_fa8 = strtod(paVar40->_M_local_buf,(char **)local_a68);
      if (local_a68 == (undefined1  [8])paVar40) goto LAB_00144ac8;
      if (*piVar22 == 0) {
LAB_0014250e:
        *piVar22 = iVar18;
      }
      else if (*piVar22 == 0x22) {
        std::__throw_out_of_range("stod");
        goto LAB_0014250e;
      }
      if (local_eb0 != (undefined1  [8])&local_ea0) {
        operator_delete((void *)local_eb0);
      }
      local_eb0 = (undefined1  [8])&local_ea0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_eb0,"--minOverlap","");
      pmVar21 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                              *)&local_1038,(key_type *)local_eb0);
      docopt::value::throwIfNotKind(pmVar21,String);
      paVar40 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(pmVar21->variant).strList.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      iVar18 = *piVar22;
      *piVar22 = 0;
      local_1058 = (_Map_pointer)strtod(paVar40->_M_local_buf,(char **)local_a68);
      if (local_a68 != (undefined1  [8])paVar40) {
        if (*piVar22 == 0) {
LAB_001425b1:
          *piVar22 = iVar18;
        }
        else if (*piVar22 == 0x22) {
          std::__throw_out_of_range("stod");
          goto LAB_001425b1;
        }
        if (local_eb0 != (undefined1  [8])&local_ea0) {
          operator_delete((void *)local_eb0);
        }
        local_f38 = &local_f28;
        local_f30 = 0;
        local_f28._vptr_sp_counted_base._0_1_ = 0;
        local_eb0 = (undefined1  [8])&local_ea0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_eb0,"--ref","");
        pmVar21 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                                *)&local_1038,(key_type *)local_eb0);
        KVar3 = pmVar21->kind;
        if (local_eb0 != (undefined1  [8])&local_ea0) {
          operator_delete((void *)local_eb0);
        }
        if (KVar3 != Empty) {
          local_eb0 = (undefined1  [8])&local_ea0;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_eb0,"--ref","");
          pmVar21 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                                  *)&local_1038,(key_type *)local_eb0);
          docopt::value::throwIfNotKind(pmVar21,String);
          std::__cxx11::string::_M_assign((string *)&local_f38);
          if (local_eb0 != (undefined1  [8])&local_ea0) {
            operator_delete((void *)local_eb0);
          }
        }
        local_eb0 = (undefined1  [8])&local_ea0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_eb0,"--FS","");
        pmVar21 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                                *)&local_1038,(key_type *)local_eb0);
        docopt::value::throwIfNotKind(pmVar21,String);
        pbVar5 = (pmVar21->variant).strList.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_ac0._M_dataplus._M_p = (pointer)&local_ac0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_ac0,pbVar5,
                   (long)&(((pmVar21->variant).strList.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus)._M_p +
                   (long)pbVar5);
        readSwitchRateFile((unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                            *)&local_7c0,&local_ac0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_ac0._M_dataplus._M_p != &local_ac0.field_2) {
          operator_delete(local_ac0._M_dataplus._M_p);
        }
        if (local_eb0 != (undefined1  [8])&local_ea0) {
          operator_delete((void *)local_eb0);
        }
        local_eb0 = (undefined1  [8])&local_ea0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_eb0,"--RS","");
        pmVar21 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                                *)&local_1038,(key_type *)local_eb0);
        docopt::value::throwIfNotKind(pmVar21,String);
        pbVar5 = (pmVar21->variant).strList.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_ae0._M_dataplus._M_p = (pointer)&local_ae0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_ae0,pbVar5,
                   (long)&(((pmVar21->variant).strList.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus)._M_p +
                   (long)pbVar5);
        readSwitchRateFile((unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                            *)&local_7f8,&local_ae0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_ae0._M_dataplus._M_p != &local_ae0.field_2) {
          operator_delete(local_ae0._M_dataplus._M_p);
        }
        if (local_eb0 != (undefined1  [8])&local_ea0) {
          operator_delete((void *)local_eb0);
        }
        if ((local_ca0 != (LogWriter *)0x0) && (local_f58._M_string_length == 0)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "Error: when using option -I, option -M must also be given.",0x3a);
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x80);
          std::ostream::put(-0x80);
          iVar18 = 1;
          std::ostream::flush();
          goto LAB_0014499f;
        }
        local_aa0._M_buckets = &local_aa0._M_single_bucket;
        local_aa0._M_bucket_count = 1;
        local_aa0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        local_aa0._M_element_count = 0;
        local_aa0._M_rehash_policy._M_max_load_factor = 1.0;
        local_aa0._M_rehash_policy._M_next_resize = 0;
        local_aa0._M_single_bucket = (__node_base_ptr)0x0;
        std::ostream::flush();
        if (local_c80 == 0) {
          maxPosition = 0;
          pLVar29 = local_ca0;
        }
        else {
          local_1050 = local_ca0;
          std::ifstream::ifstream((istream *)local_eb0,local_c88,_S_in);
          local_a68 = (undefined1  [8])local_a58;
          local_a60 = 0;
          local_a58[0]._M_local_buf[0] = '\0';
          maxPosition = 0;
          this = (locale *)(local_788 + 8);
          while( true ) {
            cVar16 = std::ios::widen((char)*(undefined8 *)((long)local_eb0 + -0x18) +
                                     (char)(istream *)local_eb0);
            piVar24 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                ((istream *)local_eb0,(string *)local_a68,cVar16);
            if (((byte)piVar24[*(long *)(*(long *)piVar24 + -0x18) + 0x20] & 5) != 0) break;
            local_588 = (undefined1  [8])0x0;
            pbStack_580 = (pointer)0x0;
            local_578[0]._M_allocated_capacity = (pointer)0x0;
            std::locale::locale((locale *)&local_bb0);
            local_188[0] = 0x2000;
            std::locale::locale(local_180,(locale *)&local_bb0);
            sVar35 = local_a60;
            auVar50 = local_a68;
            local_388._0_2_ = local_188[0];
            std::locale::locale((locale *)&local_380,local_180);
            local_788._0_2_ = local_388._0_2_;
            std::locale::locale(this,(locale *)&local_380);
            do {
              sVar53 = sVar35;
              if (sVar53 == 0) goto LAB_001429d0;
              _Var2 = ((_Hashtable<int,std::pair<int_const,double>,std::allocator<std::pair<int_const,double>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)((long)auVar50 + -1))[sVar53];
              pcVar25 = std::use_facet<std::ctype<char>>(this);
              sVar35 = sVar53 - 1;
            } while ((local_788._0_2_ &
                     *(ushort *)(*(long *)(pcVar25 + 0x30) + (ulong)(byte)_Var2 * 2)) != 0);
            auVar50 = (undefined1  [8])((long)auVar50 + sVar53);
LAB_001429d0:
            std::locale::~locale(this);
            local_a60 = (long)auVar50 - (long)local_a68;
            *(_Hashtable<int,std::pair<int_const,double>,std::allocator<std::pair<int_const,double>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)auVar50 = (_Hashtable<int,std::pair<int_const,double>,std::allocator<std::pair<int_const,double>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                           )0x0;
            std::locale::~locale((locale *)&local_380);
            std::locale::~locale(local_180);
            std::locale::~locale((locale *)&local_bb0);
            local_788 = (undefined1  [8])0x198618;
            pbStack_780 = (pointer)0x198619;
            boost::algorithm::detail::is_any_ofF<char>::
            is_any_ofF<boost::iterator_range<char_const*>>
                      ((is_any_ofF<char> *)&local_bc8,(iterator_range<const_char_*> *)local_788);
            boost::algorithm::
            split<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string&,boost::algorithm::detail::is_any_ofF<char>>
                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_588,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_a68,(is_any_ofF<char> *)&local_bc8,token_compress_on);
            if ((0x10 < local_bb8) && (local_bc8.m_dynSet != (set_value_type *)0x0)) {
              operator_delete__(local_bc8.m_dynSet);
            }
            auVar50 = local_588;
            local_788 = (undefined1  [8])0x0;
            pbStack_780 = (pointer)0x0;
            local_778[0]._M_dataplus._M_p = (pointer)0x0;
            local_388 = (undefined1  [8])0x198798;
            local_380 = "";
            boost::algorithm::detail::is_any_ofF<char>::
            is_any_ofF<boost::iterator_range<char_const*>>
                      ((is_any_ofF<char> *)&local_be0,(iterator_range<const_char_*> *)local_388);
            boost::algorithm::
            split<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string&,boost::algorithm::detail::is_any_ofF<char>>
                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_788,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auVar50,
                       (is_any_ofF<char> *)&local_be0,token_compress_on);
            if ((0x10 < local_bd0) && (local_be0.m_dynSet != (set_value_type *)0x0)) {
              operator_delete__(local_be0.m_dynSet);
            }
            auVar50 = local_588;
            if ((ulong)((long)pbStack_780 - (long)local_788) < 0x21) {
              dVar7 = atof((char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)((long)local_588 + 0x20))->_M_allocated_capacity);
              dVar8 = atof((char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)((long)auVar50 + 0x40))->_M_allocated_capacity);
              dVar9 = atof((char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)((long)auVar50 + 0x60))->_M_allocated_capacity);
              dVar10 = atof((char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                      *)((long)auVar50 + 0x80))->_M_allocated_capacity);
              dVar7 = log10(dVar10 * dVar10 + dVar9 * dVar9 + dVar8 * dVar8 + dVar7 * dVar7);
              iVar18 = atoi(*(char **)local_588);
              local_388._0_4_ = iVar18;
              pmVar26 = std::__detail::
                        _Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        ::operator[]((_Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                      *)&local_aa0,(key_type *)local_388);
              *pmVar26 = dVar7;
              maxPosition = atoi(*(char **)local_588);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_788);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_588);
          }
          std::ifstream::close();
          pLVar29 = local_1050;
          if (local_a68 != (undefined1  [8])local_a58) {
            operator_delete((void *)local_a68);
          }
          std::ifstream::~ifstream(local_eb0);
        }
        cVar27 = clock();
        local_ef8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_ef8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_ef8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_eb0 = (undefined1  [8])&local_ea0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_eb0,"");
        BamTools::SamHeader::SamHeader((SamHeader *)local_188,(string *)local_eb0);
        local_c48 = cVar27;
        if (local_eb0 != (undefined1  [8])&local_ea0) {
          operator_delete((void *)local_eb0);
        }
        local_c68.super__Vector_base<BamTools::RefData,_std::allocator<BamTools::RefData>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_c68.super__Vector_base<BamTools::RefData,_std::allocator<BamTools::RefData>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_c68.super__Vector_base<BamTools::RefData,_std::allocator<BamTools::RefData>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_b00._M_dataplus._M_p = (pointer)&local_b00.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b00,local_1100,local_1100 + local_10f8);
        local_b20._M_dataplus._M_p = (pointer)&local_b20.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b20,local_f38,
                   (long)&local_f38->_vptr_sp_counted_base + local_f30);
        local_1110 = &readBamFile(&local_b00,&local_ef8,&local_1044,(SamHeader *)local_188,
                                  &local_c68,&local_b20)->
                      super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b20._M_dataplus._M_p != &local_b20.field_2) {
          operator_delete(local_b20._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b00._M_dataplus._M_p != &local_b00.field_2) {
          operator_delete(local_b00._M_dataplus._M_p);
        }
        if (maxPosition < local_1044) {
          maxPosition = local_1044;
        }
        local_fa0 = (vector<mean_and_stddev_t,_std::allocator<mean_and_stddev_t>_> *)0x0;
        local_1044 = maxPosition;
        if ((char)local_10d0 == '\0') {
          pNVar28 = (NoMeEdgeCalculator *)operator_new(0x70);
          NewEdgeCalculator::NewEdgeCalculator
                    ((NewEdgeCalculator *)pNVar28,0.9,0.99,0.9,false,
                     (unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                      *)&local_aa0,0.95,0.6,0.97,maxPosition,false);
        }
        else {
          pNVar28 = (NoMeEdgeCalculator *)operator_new(0x80);
          local_eb0 = (undefined1  [8])&local_830;
          local_830._M_buckets = (__buckets_ptr)0x0;
          local_830._M_bucket_count = local_7c0._M_bucket_count;
          local_830._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          local_830._M_element_count = local_7c0._M_element_count;
          local_830._M_rehash_policy._M_max_load_factor =
               local_7c0._M_rehash_policy._M_max_load_factor;
          local_830._M_rehash_policy._4_4_ = local_7c0._M_rehash_policy._4_4_;
          local_830._M_rehash_policy._M_next_resize = local_7c0._M_rehash_policy._M_next_resize;
          local_830._M_single_bucket = (__node_base_ptr)0x0;
          std::
          _Hashtable<int,std::pair<int_const,double>,std::allocator<std::pair<int_const,double>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::
          _M_assign<std::_Hashtable<int,std::pair<int_const,double>,std::allocator<std::pair<int_const,double>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<int_const,double>,false>>>>
                    ((_Hashtable<int,std::pair<int_const,double>,std::allocator<std::pair<int_const,double>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)local_eb0,&local_7c0,
                     (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_int,_double>,_false>_>_>
                      *)local_eb0);
          local_eb0 = (undefined1  [8])&local_868;
          local_868._M_allocated_capacity = 0;
          local_868._8_8_ = local_7f8._M_bucket_count;
          local_858 = 0;
          local_850 = local_7f8._M_element_count;
          local_848._M_max_load_factor = local_7f8._M_rehash_policy._M_max_load_factor;
          local_848._4_4_ = local_7f8._M_rehash_policy._4_4_;
          local_848._M_next_resize = local_7f8._M_rehash_policy._M_next_resize;
          local_838 = 0;
          std::
          _Hashtable<int,std::pair<int_const,double>,std::allocator<std::pair<int_const,double>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::
          _M_assign<std::_Hashtable<int,std::pair<int_const,double>,std::allocator<std::pair<int_const,double>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<int_const,double>,false>>>>
                    ((_Hashtable<int,std::pair<int_const,double>,std::allocator<std::pair<int_const,double>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)local_eb0,&local_7f8,
                     (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_int,_double>,_false>_>_>
                      *)local_eb0);
          NoMeEdgeCalculator::NoMeEdgeCalculator
                    (pNVar28,(double)local_10d8,
                     (unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                      *)&local_830,
                     (unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                      *)&local_868);
          std::
          _Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::~_Hashtable((_Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                         *)&local_868);
          std::
          _Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::~_Hashtable(&local_830);
        }
        if (pLVar29 == (LogWriter *)0x0) {
          this_01 = (GaussianEdgeCalculator *)0x0;
          local_1040 = (long *)0x0;
LAB_00142ffa:
          iVar18 = std::__cxx11::string::compare((char *)&local_f18);
          if (iVar18 == 0) {
            pLVar29 = (LogWriter *)0x0;
          }
          else {
            pLVar29 = (LogWriter *)operator_new(0x290);
            local_b40._M_dataplus._M_p = (pointer)&local_b40.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_b40,local_f18,local_f18 + local_f10);
            LogWriter::LogWriter(pLVar29,&local_b40);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b40._M_dataplus._M_p != &local_b40.field_2) {
              operator_delete(local_b40._M_dataplus._M_p);
            }
          }
          CliqueCollector::CliqueCollector(&local_b80,pLVar29);
          local_10d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)operator_new(0x90);
          CLEVER::CLEVER((CLEVER *)local_10d0,&pNVar28->super_EdgeCalculator,&local_b80,pLVar29);
          if (this_01 != (GaussianEdgeCalculator *)0x0) {
            (**(code **)(local_10d0->_M_allocated_capacity + 0x30))(local_10d0,this_01);
          }
          local_107c = 0;
          local_1080 = 0;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"start: ",7);
          std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          local_bb0._M_impl.super__Rb_tree_header._M_header._M_left =
               &local_bb0._M_impl.super__Rb_tree_header._M_header;
          local_bb0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_bb0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_bb0._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_1050 = pLVar29;
          local_c50 = pNVar28;
          local_bb0._M_impl.super__Rb_tree_header._M_header._M_right =
               local_bb0._M_impl.super__Rb_tree_header._M_header._M_left;
          if ((int)local_f60 != 0) {
            iVar18 = (int)(double)local_1058;
            local_c38 = &pLVar29->vertices_;
            local_c40 = &pLVar29->cliques_;
            local_10d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)0x3ff0000000000000;
            iVar52 = 0;
            do {
              if (local_bb0._M_impl.super__Rb_tree_header._M_node_count != 0) {
                std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                ::clear(&local_bb0);
              }
              (**(code **)(local_10d0->_M_allocated_capacity + 0x18))(local_10d0,&local_bb0);
              if (local_1050 != (LogWriter *)0x0) {
                std::
                _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                ::clear(&local_c38->_M_t);
                std::
                _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                ::clear(&local_c40->_M_t);
              }
              ppAVar30 = (local_1110->_M_impl).super__Deque_impl_data._M_start._M_cur;
              ppAVar6 = (local_1110->_M_impl).super__Deque_impl_data._M_finish._M_cur;
              if (ppAVar6 != ppAVar30) {
                pppAVar51 = (local_1110->_M_impl).super__Deque_impl_data._M_finish._M_node;
                local_10d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)((double)local_10d8 * -3.0 +
                                1.0 / (double)(int)((int)((ulong)((long)(local_1110->_M_impl).
                                                                        super__Deque_impl_data.
                                                                        _M_start._M_last -
                                                                 (long)ppAVar30) >> 3) +
                                                    (int)((ulong)((long)ppAVar6 -
                                                                 (long)(local_1110->_M_impl).
                                                                       super__Deque_impl_data.
                                                                       _M_finish._M_first) >> 3) +
                                                   ((((uint)((int)pppAVar51 -
                                                            *(int *)&(local_1110->_M_impl).
                                                                     super__Deque_impl_data._M_start
                                                                     ._M_node) >> 3) - 1) +
                                                   (uint)(pppAVar51 == (_Map_pointer)0x0)) * 0x40));
                do {
                  local_eb0 = (undefined1  [8])*ppAVar30;
                  std::deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>::pop_front
                            ((deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_> *)
                             local_1110);
                  if (iVar52 == 0) {
LAB_0014331e:
                    (**(code **)(local_10d0->_M_allocated_capacity + 0x10))
                              (local_10d0,local_eb0,&local_107c,&local_1080,iVar18,iVar52);
                  }
                  else if (iVar52 == 1) {
                    if (((char)local_10a8 == '\0') ||
                       (((undefined1  [16])
                         *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)((long)local_eb0 + 0x1b0) & (undefined1  [16])0xfffffffe) !=
                        (undefined1  [16])0x0)) goto LAB_0014331e;
                  }
                  else {
                    dVar7 = AlignmentRecord::getProbability((AlignmentRecord *)local_eb0);
                    if ((double)local_10d8 <= dVar7) goto LAB_0014331e;
                  }
                  auVar50 = local_eb0;
                  if (local_eb0 != (undefined1  [8])0x0) {
                    AlignmentRecord::~AlignmentRecord((AlignmentRecord *)local_eb0);
                    operator_delete((void *)auVar50);
                  }
                  ppAVar30 = (local_1110->_M_impl).super__Deque_impl_data._M_start._M_cur;
                } while ((local_1110->_M_impl).super__Deque_impl_data._M_finish._M_cur != ppAVar30);
              }
              local_1058 = (_Map_pointer)CONCAT71(local_1058._1_7_,2 < iVar18);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"\tedges: ",8);
              std::ostream::operator<<((ostream *)&std::cout,local_107c);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"\tnonEdges: ",0xb);
              plVar31 = (long *)std::ostream::operator<<((ostream *)&std::cout,local_1080);
              std::ios::widen((char)*(undefined8 *)(*plVar31 + -0x18) + (char)plVar31);
              std::ostream::put((char)plVar31);
              std::ostream::flush();
              std::_Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>::~_Deque_base
                        (local_1110);
              operator_delete(local_1110);
              (**(code **)(local_10d0->_M_allocated_capacity + 0x20))();
              local_1110 = &CliqueCollector::finish(&local_b80)->
                            super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>
              ;
              if (local_1050 != (LogWriter *)0x0) {
                LogWriter::finish(local_1050);
              }
              local_10d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)setProbabilities((deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>
                                                *)local_1110);
              cVar16 = (**(code **)(local_10d0->_M_allocated_capacity + 0x38))();
              if (cVar16 != '\0') break;
              poVar19 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar52);
              std::__ostream_insert<char,std::char_traits<char>>(poVar19,": ",2);
              std::ostream::_M_insert<unsigned_long>((ulong)poVar19);
              iVar18 = iVar18 - (uint)(byte)local_1058;
              iVar52 = iVar52 + 1;
              local_107c = 0;
              local_1080 = 0;
            } while (iVar52 != (int)local_f60);
          }
          local_a68 = (undefined1  [8])local_a58;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_a68,local_1078,local_1078 + local_1070);
          std::__cxx11::string::append(local_a68);
          std::ofstream::ofstream(local_eb0,(string *)local_a68,_S_out);
          if (local_a68 != (undefined1  [8])local_a58) {
            operator_delete((void *)local_a68);
          }
          setProbabilities((deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_> *)
                           local_1110);
          if (-1.0 < local_fa8) {
            local_788 = (undefined1  [8])local_778;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_788,local_1078,local_1078 + local_1070);
            std::__cxx11::string::append(local_788);
            plVar31 = (long *)std::__cxx11::string::append(local_788);
            paVar40 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(plVar31 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar31 == paVar40) {
              local_578[0]._0_8_ = paVar40->_M_allocated_capacity;
              local_578[0]._8_8_ = plVar31[3];
              local_588 = (undefined1  [8])local_578;
            }
            else {
              local_578[0]._0_8_ = paVar40->_M_allocated_capacity;
              local_588 = (undefined1  [8])*plVar31;
            }
            pbStack_580 = (pointer)plVar31[1];
            *plVar31 = (long)paVar40;
            plVar31[1] = 0;
            *(undefined1 *)(plVar31 + 2) = 0;
            std::ofstream::ofstream(local_a68,(string *)local_588,_S_out);
            if (local_588 != (undefined1  [8])local_578) {
              operator_delete((void *)local_588);
            }
            if (local_788 != (undefined1  [8])local_778) {
              operator_delete((void *)local_788);
            }
            local_388 = (undefined1  [8])&local_378;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_388,local_1078,local_1078 + local_1070);
            std::__cxx11::string::append(local_388);
            plVar31 = (long *)std::__cxx11::string::append(local_388);
            pbVar37 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (plVar31 + 2);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar31 ==
                pbVar37) {
              local_778[0]._M_dataplus._M_p = (pbVar37->_M_dataplus)._M_p;
              local_778[0]._M_string_length = plVar31[3];
              local_788 = (undefined1  [8])local_778;
            }
            else {
              local_778[0]._M_dataplus._M_p = (pbVar37->_M_dataplus)._M_p;
              local_788 = (undefined1  [8])*plVar31;
            }
            pbStack_780 = (pointer)plVar31[1];
            *plVar31 = (long)pbVar37;
            plVar31[1] = 0;
            *(undefined1 *)(plVar31 + 2) = 0;
            std::ofstream::ofstream(local_588,(string *)local_788,_S_out);
            if (local_788 != (undefined1  [8])local_778) {
              operator_delete((void *)local_788);
            }
            if (local_388 != (undefined1  [8])&local_378) {
              operator_delete((void *)local_388);
            }
            pp_Var12 = &local_f98._M_impl.super__Rb_tree_header._M_header._M_parent;
            local_f98._M_impl._0_8_ = pp_Var12;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_f98,local_1078,local_1078 + local_1070);
            std::__cxx11::string::append((char *)&local_f98);
            plVar31 = (long *)std::__cxx11::string::append((char *)&local_f98);
            plVar38 = plVar31 + 2;
            if ((long *)*plVar31 == plVar38) {
              local_378 = *plVar38;
              lStack_370 = plVar31[3];
              local_388 = (undefined1  [8])&local_378;
            }
            else {
              local_378 = *plVar38;
              local_388 = (undefined1  [8])*plVar31;
            }
            local_380 = (char *)plVar31[1];
            *plVar31 = (long)plVar38;
            plVar31[1] = 0;
            *(undefined1 *)(plVar31 + 2) = 0;
            std::ofstream::ofstream(local_788,(string *)local_388,_S_out);
            if (local_388 != (undefined1  [8])&local_378) {
              operator_delete((void *)local_388);
            }
            if ((_Base_ptr *)local_f98._M_impl._0_8_ != pp_Var12) {
              operator_delete((void *)local_f98._M_impl._0_8_);
            }
            local_1008._M_impl._0_8_ = &local_1008._M_impl.super__Rb_tree_header._M_header._M_parent
            ;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1008,local_1078,local_1078 + local_1070);
            std::__cxx11::string::append((char *)&local_1008);
            plVar31 = (long *)std::__cxx11::string::append((char *)&local_1008);
            plVar38 = plVar31 + 2;
            if ((_Base_ptr *)*plVar31 == (_Base_ptr *)plVar38) {
              local_f98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar38;
              local_f98._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)plVar31[3];
              local_f98._M_impl._0_8_ = pp_Var12;
            }
            else {
              local_f98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar38;
              local_f98._M_impl._0_8_ = (_Base_ptr *)*plVar31;
            }
            local_f98._M_impl.super__Rb_tree_header._M_header._0_8_ = plVar31[1];
            *plVar31 = (long)plVar38;
            plVar31[1] = 0;
            *(undefined1 *)(plVar31 + 2) = 0;
            std::ofstream::ofstream(local_388,(string *)&local_f98,_S_out);
            if ((_Base_ptr *)local_f98._M_impl._0_8_ != pp_Var12) {
              operator_delete((void *)local_f98._M_impl._0_8_);
            }
            if ((_Base_ptr *)local_1008._M_impl._0_8_ !=
                &local_1008._M_impl.super__Rb_tree_header._M_header._M_parent) {
              operator_delete((void *)local_1008._M_impl._0_8_);
            }
            local_f98._M_impl.super__Rb_tree_header._M_header._M_left =
                 &local_f98._M_impl.super__Rb_tree_header._M_header;
            local_f98._M_impl.super__Rb_tree_header._M_header._0_8_ =
                 local_f98._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
            local_f98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            local_f98._M_impl.super__Rb_tree_header._M_node_count = 0;
            paVar40 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(local_1110->_M_impl).super__Deque_impl_data._M_start._M_cur;
            paVar54 = paVar40;
            local_f98._M_impl.super__Rb_tree_header._M_header._M_right =
                 local_f98._M_impl.super__Rb_tree_header._M_header._M_left;
            if (paVar40 !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_1110->_M_impl).super__Deque_impl_data._M_finish._M_cur) {
              local_10a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)(local_1110->_M_impl).super__Deque_impl_data._M_start._M_last;
              local_1058 = (local_1110->_M_impl).super__Deque_impl_data._M_start._M_node;
              do {
                local_10d8 = paVar40;
                AlignmentRecord::getConsistingReads_abi_cxx11_
                          ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&local_ee0,(AlignmentRecord *)paVar40->_M_allocated_capacity);
                plVar31 = (long *)CONCAT44(local_ed8._4_4_,local_ed8._0_4_);
                for (plVar38 = local_ee0; plVar38 != plVar31; plVar38 = plVar38 + 4) {
                  local_1008._M_impl._0_8_ =
                       &local_1008._M_impl.super__Rb_tree_header._M_header._M_parent;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_1008,*plVar38,*plVar38 + plVar38[1]);
                  lVar23 = std::__cxx11::string::find((char *)&local_1008,0x19881a,0);
                  if ((lVar23 == -1) &&
                     (lVar23 = std::__cxx11::string::find((char *)&local_1008,0x19881e,0),
                     lVar23 == -1)) {
                    local_fd8._0_8_ =
                         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)(local_fd8 + 0x10);
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)local_fd8,local_1008._M_impl._0_8_,
                               local_1008._M_impl._0_8_ +
                               CONCAT44(local_1008._M_impl.super__Rb_tree_header._M_header._4_4_,
                                        local_1008._M_impl.super__Rb_tree_header._M_header._M_color)
                              );
                    uVar36 = local_fd8._0_8_;
                    _Var32 = std::
                             __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<std::unary_negate<std::pointer_to_unary_function<int,int>>>>
                                       (local_fd8._0_8_,(char *)(local_fd8._0_8_ + local_fd8._8_8_),
                                        isspace);
                    uVar44 = uVar36 - local_fd8._0_8_;
                    if ((char *)(local_fd8._0_8_ + local_fd8._8_8_) == _Var32._M_current) {
                      *(char *)(local_fd8._0_8_ + uVar44) = '\0';
                      local_fd8._8_8_ = uVar44;
                    }
                    else {
                      std::__cxx11::string::_M_erase((ulong)local_fd8,uVar44);
                    }
                    local_c30._0_8_ = local_fd8._0_8_ + local_fd8._8_8_;
                    local_10c8._M_dataplus._M_p = (pointer)local_fd8._0_8_;
                    std::
                    __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,__gnu_cxx::__ops::_Iter_pred<std::unary_negate<std::pointer_to_unary_function<int,int>>>>
                              (&local_10a0,local_c30,&local_10c8,isspace);
                    local_fd8._8_8_ =
                         (long)local_10a0.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start - local_fd8._0_8_;
                    *(_Hashtable<int,std::pair<int_const,double>,std::allocator<std::pair<int_const,double>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)local_10a0.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start =
                         (_Hashtable<int,std::pair<int_const,double>,std::allocator<std::pair<int_const,double>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                          )0x0;
                    iVar33 = std::
                             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                             ::find(&local_f98,(key_type *)local_fd8);
                    if ((_Rb_tree_header *)iVar33._M_node ==
                        &local_f98._M_impl.super__Rb_tree_header) {
                      pmVar34 = std::
                                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                              *)&local_f98,(key_type *)local_fd8);
                      *pmVar34 = 1;
                    }
                    else {
                      pmVar34 = std::
                                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                              *)&local_f98,(key_type *)local_fd8);
                      iVar18 = *pmVar34;
                      pmVar34 = std::
                                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                              *)&local_f98,(key_type *)local_fd8);
                      *pmVar34 = iVar18 + 1;
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_fd8._0_8_ !=
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(local_fd8 + 0x10)) {
                      operator_delete((void *)local_fd8._0_8_);
                    }
                  }
                  if ((_Base_ptr *)local_1008._M_impl._0_8_ !=
                      &local_1008._M_impl.super__Rb_tree_header._M_header._M_parent) {
                    operator_delete((void *)local_1008._M_impl._0_8_);
                  }
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_ee0);
                paVar40 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(local_10d8->_M_local_buf + 8);
                if (paVar40 == local_10a8) {
                  paVar40 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_1058[1];
                  local_1058 = local_1058 + 1;
                  local_10a8 = paVar40 + 0x20;
                }
              } while (paVar40 !=
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(local_1110->_M_impl).super__Deque_impl_data._M_finish._M_cur);
              paVar54 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(local_1110->_M_impl).super__Deque_impl_data._M_start._M_cur;
            }
            local_1008._M_impl.super__Rb_tree_header._M_header._M_left =
                 &local_1008._M_impl.super__Rb_tree_header._M_header;
            local_1008._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            local_1008._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            local_1008._M_impl.super__Rb_tree_header._M_node_count = 0;
            local_fd8._24_8_ = local_fd8 + 8;
            local_fd8._8_8_ = local_fd8._8_8_ & 0xffffffff00000000;
            local_fd8._16_8_ = (undefined1 *)0x0;
            local_fb0 = 0;
            local_ec8 = (_Base_ptr)local_ed8;
            local_ed8._0_4_ = _S_red;
            local_ed0 = (_Base_ptr)0x0;
            local_eb8 = 0;
            local_c18 = (_Base_ptr)(local_c30 + 8);
            local_c30._8_4_ = _S_red;
            local_c20 = (_Base_ptr)0x0;
            local_c08 = 0;
            local_1008._M_impl.super__Rb_tree_header._M_header._M_right =
                 local_1008._M_impl.super__Rb_tree_header._M_header._M_left;
            local_fb8 = (_Base_ptr)local_fd8._24_8_;
            local_ec0 = local_ec8;
            local_c10 = local_c18;
            if (paVar54 != paVar40) {
              local_10d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)(local_1110->_M_impl).super__Deque_impl_data._M_start._M_last;
              local_10a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)(local_1110->_M_impl).super__Deque_impl_data._M_start._M_node;
              do {
                AlignmentRecord::getConsistingReads_abi_cxx11_
                          (&local_10a0,(AlignmentRecord *)paVar54->_M_allocated_capacity);
                pbVar5 = local_10a0.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                if (local_10a0.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start ==
                    local_10a0.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
LAB_00143f29:
                  pkVar45 = (key_type *)(paVar54->_M_allocated_capacity + 0x314);
                  if ((undefined1 *)local_fd8._16_8_ == (undefined1 *)0x0) {
LAB_00143f92:
                    pmVar34 = std::
                              map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                              ::operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                            *)local_fd8,pkVar45);
                    *pmVar34 = 1;
                  }
                  else {
                    iVar18 = *(int *)(paVar54->_M_allocated_capacity + 0x314);
                    puVar15 = (undefined1 *)local_fd8._16_8_;
                    puVar49 = local_fd8 + 8;
                    do {
                      puVar48 = puVar49;
                      puVar42 = puVar15;
                      iVar52 = *(int *)(puVar42 + 0x20);
                      puVar49 = puVar42;
                      if (iVar52 < iVar18) {
                        puVar49 = puVar48;
                      }
                      puVar15 = *(undefined1 **)(puVar42 + (ulong)(iVar52 < iVar18) * 8 + 0x10);
                    } while (*(undefined1 **)(puVar42 + (ulong)(iVar52 < iVar18) * 8 + 0x10) !=
                             (undefined1 *)0x0);
                    if (puVar49 == local_fd8 + 8) goto LAB_00143f92;
                    if (iVar52 < iVar18) {
                      puVar42 = puVar48;
                    }
                    if (iVar18 < *(int *)(puVar42 + 0x20)) goto LAB_00143f92;
                    pmVar34 = std::
                              map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                              ::operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                            *)local_fd8,pkVar45);
                    iVar18 = *pmVar34;
                    pmVar34 = std::
                              map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                              ::operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                            *)local_fd8,
                                           (key_type *)(paVar54->_M_allocated_capacity + 0x314));
                    *pmVar34 = iVar18 + 1;
                  }
                  plVar31 = (long *)std::ostream::operator<<
                                              ((ostream *)local_588,
                                               *(int *)(paVar54->_M_allocated_capacity + 0x314));
                  std::ios::widen((char)*(undefined8 *)(*plVar31 + -0x18) + (char)plVar31);
                  std::ostream::put((char)plVar31);
                  std::ostream::flush();
                  pkVar45 = (key_type *)(paVar54->_M_allocated_capacity + 0x310);
                  if (local_1008._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0
                     ) {
LAB_00144047:
                    pmVar34 = std::
                              map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                              ::operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                            *)&local_1008,pkVar45);
                    *pmVar34 = 1;
                  }
                  else {
                    iVar18 = *pkVar45;
                    p_Var14 = local_1008._M_impl.super__Rb_tree_header._M_header._M_parent;
                    p_Var47 = &local_1008._M_impl.super__Rb_tree_header._M_header;
                    do {
                      p_Var46 = p_Var47;
                      p_Var41 = p_Var14;
                      _Var4 = p_Var41[1]._M_color;
                      p_Var47 = p_Var41;
                      if ((int)_Var4 < iVar18) {
                        p_Var47 = p_Var46;
                      }
                      p_Var14 = (&p_Var41->_M_left)[(int)_Var4 < iVar18];
                    } while ((&p_Var41->_M_left)[(int)_Var4 < iVar18] != (_Base_ptr)0x0);
                    if ((_Rb_tree_header *)p_Var47 == &local_1008._M_impl.super__Rb_tree_header)
                    goto LAB_00144047;
                    if ((int)_Var4 < iVar18) {
                      p_Var41 = p_Var46;
                    }
                    if (iVar18 < (int)p_Var41[1]._M_color) goto LAB_00144047;
                    pmVar34 = std::
                              map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                              ::operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                            *)&local_1008,pkVar45);
                    iVar18 = *pmVar34;
                    pmVar34 = std::
                              map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                              ::operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                            *)&local_1008,
                                           (key_type *)(paVar54->_M_allocated_capacity + 0x310));
                    *pmVar34 = iVar18 + 1;
                  }
                  plVar31 = (long *)std::ostream::operator<<
                                              ((ostream *)local_388,
                                               *(int *)(paVar54->_M_allocated_capacity + 0x310));
                  std::ios::widen((char)*(undefined8 *)(*plVar31 + -0x18) + (char)plVar31);
                }
                else {
                  iVar52 = 0;
                  iVar18 = 0;
                  paVar40 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_10a0.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                  do {
                    local_10c8._M_dataplus._M_p = (pointer)&local_10c8.field_2;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_10c8,paVar40->_M_allocated_capacity,
                               *(long *)(paVar40->_M_local_buf + 8) + paVar40->_M_allocated_capacity
                              );
                    lVar23 = std::__cxx11::string::find((char *)&local_10c8,0x19881a,0);
                    if ((lVar23 == -1) &&
                       (lVar23 = std::__cxx11::string::find((char *)&local_10c8,0x19881e,0),
                       lVar23 == -1)) {
                      pmVar34 = std::
                                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                              *)&local_f98,&local_10c8);
                      if (*pmVar34 < 2) {
                        pmVar34 = std::
                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                                *)&local_f98,&local_10c8);
                        if (*pmVar34 == 1) {
                          sVar35 = paVar54->_M_allocated_capacity;
                          *(int *)(sVar35 + 0x314) = *(int *)(sVar35 + 0x314) + 1;
                          goto LAB_00143d4b;
                        }
                      }
                      else {
                        sVar35 = paVar54->_M_allocated_capacity;
LAB_00143d4b:
                        *(int *)(sVar35 + 0x310) = *(int *)(sVar35 + 0x310) + 1;
                      }
                      lVar23 = std::__cxx11::string::find((char *)&local_10c8,0x198825,0);
                      iVar18 = iVar18 + (uint)(lVar23 != -1);
                      lVar23 = std::__cxx11::string::find((char *)&local_10c8,0x19882d,0);
                      iVar52 = iVar52 + (uint)(lVar23 != -1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_10c8._M_dataplus._M_p != &local_10c8.field_2) {
                      operator_delete(local_10c8._M_dataplus._M_p);
                    }
                    paVar40 = paVar40 + 2;
                  } while (paVar40 !=
                           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)pbVar5);
                  if ((iVar18 == 0) || (iVar52 == 0)) goto LAB_00143f29;
                  pkVar45 = (key_type *)(paVar54->_M_allocated_capacity + 0x314);
                  if (local_c20 == (_Base_ptr)0x0) {
LAB_00143e2f:
                    pmVar34 = std::
                              map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                              ::operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                            *)local_c30,pkVar45);
                    *pmVar34 = 1;
                  }
                  else {
                    iVar18 = *(int *)(paVar54->_M_allocated_capacity + 0x314);
                    p_Var14 = local_c20;
                    p_Var47 = (_Base_ptr)(local_c30 + 8);
                    do {
                      p_Var46 = p_Var47;
                      p_Var41 = p_Var14;
                      _Var4 = p_Var41[1]._M_color;
                      p_Var47 = p_Var41;
                      if ((int)_Var4 < iVar18) {
                        p_Var47 = p_Var46;
                      }
                      p_Var14 = (&p_Var41->_M_left)[(int)_Var4 < iVar18];
                    } while ((&p_Var41->_M_left)[(int)_Var4 < iVar18] != (_Base_ptr)0x0);
                    if (p_Var47 == (_Base_ptr)(local_c30 + 8)) goto LAB_00143e2f;
                    if ((int)_Var4 < iVar18) {
                      p_Var41 = p_Var46;
                    }
                    if (iVar18 < (int)p_Var41[1]._M_color) goto LAB_00143e2f;
                    pmVar34 = std::
                              map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                              ::operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                            *)local_c30,pkVar45);
                    iVar18 = *pmVar34;
                    pmVar34 = std::
                              map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                              ::operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                            *)local_c30,
                                           (key_type *)(paVar54->_M_allocated_capacity + 0x314));
                    *pmVar34 = iVar18 + 1;
                  }
                  plVar31 = (long *)std::ostream::operator<<
                                              ((ostream *)local_a68,
                                               *(int *)(paVar54->_M_allocated_capacity + 0x314));
                  std::ios::widen((char)*(undefined8 *)(*plVar31 + -0x18) + (char)plVar31);
                  std::ostream::put((char)plVar31);
                  std::ostream::flush();
                  pkVar45 = (key_type *)(paVar54->_M_allocated_capacity + 0x310);
                  if (local_ed0 == (_Base_ptr)0x0) {
LAB_00143ee4:
                    pmVar34 = std::
                              map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                              ::operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                            *)&local_ee0,pkVar45);
                    *pmVar34 = 1;
                  }
                  else {
                    iVar18 = *pkVar45;
                    p_Var14 = local_ed0;
                    p_Var47 = (_Base_ptr)local_ed8;
                    do {
                      p_Var46 = p_Var47;
                      p_Var41 = p_Var14;
                      _Var4 = p_Var41[1]._M_color;
                      p_Var47 = p_Var41;
                      if ((int)_Var4 < iVar18) {
                        p_Var47 = p_Var46;
                      }
                      p_Var14 = (&p_Var41->_M_left)[(int)_Var4 < iVar18];
                    } while ((&p_Var41->_M_left)[(int)_Var4 < iVar18] != (_Base_ptr)0x0);
                    if (p_Var47 == (_Base_ptr)local_ed8) goto LAB_00143ee4;
                    if ((int)_Var4 < iVar18) {
                      p_Var41 = p_Var46;
                    }
                    if (iVar18 < (int)p_Var41[1]._M_color) goto LAB_00143ee4;
                    pmVar34 = std::
                              map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                              ::operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                            *)&local_ee0,pkVar45);
                    iVar18 = *pmVar34;
                    pmVar34 = std::
                              map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                              ::operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                            *)&local_ee0,
                                           (key_type *)(paVar54->_M_allocated_capacity + 0x310));
                    *pmVar34 = iVar18 + 1;
                  }
                  plVar31 = (long *)std::ostream::operator<<
                                              ((ostream *)local_788,
                                               *(int *)(paVar54->_M_allocated_capacity + 0x310));
                  std::ios::widen((char)*(undefined8 *)(*plVar31 + -0x18) + (char)plVar31);
                }
                std::ostream::put((char)plVar31);
                std::ostream::flush();
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_10a0);
                paVar54 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(paVar54->_M_local_buf + 8);
                if (paVar54 == local_10d8) {
                  paVar54 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              **)(local_10a8->_M_local_buf + 8);
                  local_10a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                *)(local_10a8->_M_local_buf + 8);
                  local_10d8 = paVar54 + 0x20;
                }
              } while (paVar54 !=
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(local_1110->_M_impl).super__Deque_impl_data._M_finish._M_cur);
            }
            std::ofstream::close();
            std::ofstream::close();
            std::ofstream::close();
            std::ofstream::close();
            if (bVar1 == false) {
              ppbVar11 = &local_10a0.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage;
              local_10a0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar11;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_10a0,local_1078,local_1078 + local_1070);
              std::__cxx11::string::append((char *)&local_10a0);
              plVar31 = (long *)std::__cxx11::string::append((char *)&local_10a0);
              paVar40 = &local_10c8.field_2;
              psVar39 = (size_type *)(plVar31 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar31 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar39) {
                local_10c8.field_2._M_allocated_capacity = *psVar39;
                local_10c8.field_2._8_8_ = plVar31[3];
                local_10c8._M_dataplus._M_p = (pointer)paVar40;
              }
              else {
                local_10c8.field_2._M_allocated_capacity = *psVar39;
                local_10c8._M_dataplus._M_p = (pointer)*plVar31;
              }
              local_10c8._M_string_length = plVar31[1];
              *plVar31 = (long)psVar39;
              plVar31[1] = 0;
              *(undefined1 *)(plVar31 + 2) = 0;
              remove(local_10c8._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_10c8._M_dataplus._M_p != paVar40) {
                operator_delete(local_10c8._M_dataplus._M_p);
              }
              if (local_10a0.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar11) {
                operator_delete(local_10a0.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
              }
              local_10a0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar11;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_10a0,local_1078,local_1078 + local_1070);
              std::__cxx11::string::append((char *)&local_10a0);
              plVar31 = (long *)std::__cxx11::string::append((char *)&local_10a0);
              psVar39 = (size_type *)(plVar31 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar31 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar39) {
                local_10c8.field_2._M_allocated_capacity = *psVar39;
                local_10c8.field_2._8_8_ = plVar31[3];
                local_10c8._M_dataplus._M_p = (pointer)paVar40;
              }
              else {
                local_10c8.field_2._M_allocated_capacity = *psVar39;
                local_10c8._M_dataplus._M_p = (pointer)*plVar31;
              }
              local_10c8._M_string_length = plVar31[1];
              *plVar31 = (long)psVar39;
              plVar31[1] = 0;
              *(undefined1 *)(plVar31 + 2) = 0;
              remove(local_10c8._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_10c8._M_dataplus._M_p != paVar40) {
                operator_delete(local_10c8._M_dataplus._M_p);
              }
              if (local_10a0.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar11) {
                operator_delete(local_10a0.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
              }
              local_10a0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar11;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_10a0,local_1078,local_1078 + local_1070);
              std::__cxx11::string::append((char *)&local_10a0);
              plVar31 = (long *)std::__cxx11::string::append((char *)&local_10a0);
              psVar39 = (size_type *)(plVar31 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar31 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar39) {
                local_10c8.field_2._M_allocated_capacity = *psVar39;
                local_10c8.field_2._8_8_ = plVar31[3];
                local_10c8._M_dataplus._M_p = (pointer)paVar40;
              }
              else {
                local_10c8.field_2._M_allocated_capacity = *psVar39;
                local_10c8._M_dataplus._M_p = (pointer)*plVar31;
              }
              local_10c8._M_string_length = plVar31[1];
              *plVar31 = (long)psVar39;
              plVar31[1] = 0;
              *(undefined1 *)(plVar31 + 2) = 0;
              remove(local_10c8._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_10c8._M_dataplus._M_p != paVar40) {
                operator_delete(local_10c8._M_dataplus._M_p);
              }
              if (local_10a0.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar11) {
                operator_delete(local_10a0.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
              }
              local_10a0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar11;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_10a0,local_1078,local_1078 + local_1070);
              std::__cxx11::string::append((char *)&local_10a0);
              plVar31 = (long *)std::__cxx11::string::append((char *)&local_10a0);
              psVar39 = (size_type *)(plVar31 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar31 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar39) {
                local_10c8.field_2._M_allocated_capacity = *psVar39;
                local_10c8.field_2._8_8_ = plVar31[3];
                local_10c8._M_dataplus._M_p = (pointer)paVar40;
              }
              else {
                local_10c8.field_2._M_allocated_capacity = *psVar39;
                local_10c8._M_dataplus._M_p = (pointer)*plVar31;
              }
              local_10c8._M_string_length = plVar31[1];
              *plVar31 = (long)psVar39;
              plVar31[1] = 0;
              *(undefined1 *)(plVar31 + 2) = 0;
              remove(local_10c8._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_10c8._M_dataplus._M_p != paVar40) {
                operator_delete(local_10c8._M_dataplus._M_p);
              }
              if (local_10a0.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar11) {
                operator_delete(local_10a0.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
              }
            }
            std::
            _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
            ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         *)local_c30);
            std::
            _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
            ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         *)&local_ee0);
            std::
            _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
            ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         *)local_fd8);
            std::
            _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
            ::~_Rb_tree(&local_1008);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ::~_Rb_tree(&local_f98);
            uVar36 = _sqrt;
            paVar40 = _VTT;
            local_388 = (undefined1  [8])_VTT;
            *(undefined8 *)(local_388 + *(long *)((long)_VTT + -0x18)) = _sqrt;
            std::filebuf::~filebuf((filebuf *)&local_380);
            std::ios_base::~ios_base(aiStack_290);
            local_788 = (undefined1  [8])paVar40;
            *(undefined8 *)(local_788 + *(long *)((long)paVar40 + -0x18)) = uVar36;
            std::filebuf::~filebuf((filebuf *)(local_788 + 8));
            std::ios_base::~ios_base(aiStack_690);
            local_588 = (undefined1  [8])paVar40;
            *(undefined8 *)(local_588 + *(long *)((long)paVar40 + -0x18)) = uVar36;
            std::filebuf::~filebuf((filebuf *)&pbStack_580);
            std::ios_base::~ios_base(aiStack_490);
            local_a68 = (undefined1  [8])paVar40;
            *(undefined8 *)(local_a68 + *(long *)((long)paVar40 + -0x18)) = uVar36;
            std::filebuf::~filebuf((filebuf *)&local_a60);
            std::ios_base::~ios_base(local_970);
          }
          printReads((ostream *)local_eb0,
                     (deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_> *)local_1110,
                     (int)local_f68);
          if (local_10d9 != '\0') {
            local_b60._M_dataplus._M_p = (pointer)&local_b60.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_b60,local_1078,local_1078 + local_1070);
            printBAM(&local_b60,
                     (deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_> *)local_1110,
                     (SamHeader *)local_188,&local_c68,local_fa8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b60._M_dataplus._M_p != &local_b60.field_2) {
              operator_delete(local_b60._M_dataplus._M_p);
            }
            if (bVar1 != false) {
              local_588 = (undefined1  [8])local_578;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_588,local_1078,local_1078 + local_1070);
              std::__cxx11::string::append(local_588);
              std::ofstream::ofstream(local_a68,(string *)local_588,_S_out);
              if (local_588 != (undefined1  [8])local_578) {
                operator_delete((void *)local_588);
              }
              printConsistingReads
                        ((ostream *)local_a68,
                         (deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_> *)local_1110,
                         local_fa8);
              local_a68 = (undefined1  [8])_VTT;
              *(undefined8 *)(local_a68 + *(long *)((long)_VTT + -0x18)) = _sqrt;
              std::filebuf::~filebuf((filebuf *)&local_a60);
              std::ios_base::~ios_base(local_970);
            }
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"final: ",7);
          poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar19 + -0x18) + (char)poVar19);
          std::ostream::put((char)poVar19);
          std::ostream::flush();
          ppAVar30 = (local_1110->_M_impl).super__Deque_impl_data._M_start._M_cur;
          ppAVar6 = (local_1110->_M_impl).super__Deque_impl_data._M_finish._M_cur;
          if (ppAVar30 != ppAVar6) {
            ppAVar43 = (local_1110->_M_impl).super__Deque_impl_data._M_start._M_last;
            pppAVar51 = (local_1110->_M_impl).super__Deque_impl_data._M_start._M_node;
            do {
              this_00 = *ppAVar30;
              if (this_00 != (AlignmentRecord *)0x0) {
                AlignmentRecord::~AlignmentRecord(this_00);
              }
              operator_delete(this_00);
              ppAVar30 = ppAVar30 + 1;
              if (ppAVar30 == ppAVar43) {
                ppAVar30 = pppAVar51[1];
                pppAVar51 = pppAVar51 + 1;
                ppAVar43 = ppAVar30 + 0x40;
              }
            } while (ppAVar30 != ppAVar6);
          }
          std::_Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>::~_Deque_base
                    (local_1110);
          operator_delete(local_1110);
          pNVar28 = local_c50;
          if (local_1040 != (long *)0x0) {
            std::ofstream::close();
            (**(code **)(*local_1040 + 8))();
          }
          (*(pNVar28->super_EdgeCalculator)._vptr_EdgeCalculator[1])(pNVar28);
          if (local_1050 != (LogWriter *)0x0) {
            (*local_1050->_vptr_LogWriter[1])();
          }
          (**(code **)(local_10d0->_M_allocated_capacity + 8))();
          lVar23 = std::cout;
          *(undefined8 *)(BamTools::SamReadGroup::SamReadGroup + *(long *)(std::cout + -0x18)) = 3;
          *(uint *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar23 + -0x18)) =
               *(uint *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar23 + -0x18)) &
               0xfffffefb | 4;
          cVar27 = clock();
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"time: ",6);
          poVar19 = std::ostream::_M_insert<double>((double)(cVar27 - local_c48) / 1000000.0);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar19 + -0x18) + (char)poVar19);
          std::ostream::put((char)poVar19);
          std::ostream::flush();
          local_eb0 = (undefined1  [8])_VTT;
          *(undefined8 *)(local_eb0 + *(long *)((long)_VTT + -0x18)) = _sqrt;
          std::filebuf::~filebuf((filebuf *)&local_ea8);
          std::ios_base::~ios_base(local_db8);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::~_Rb_tree(&local_bb0);
          local_b80._vptr_CliqueCollector = (_func_int **)&PTR__CliqueCollector_001b7988;
          if (&(local_b80.superReads)->
               super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_> !=
              (_Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_> *)0x0) {
            std::_Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>::~_Deque_base
                      (&(local_b80.superReads)->
                        super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>);
          }
          operator_delete(local_b80.superReads);
          iVar18 = 0;
        }
        else {
          local_eb0 = (undefined1  [8])0xbff0000000000000;
          local_a68 = (undefined1  [8])0xbff0000000000000;
          bVar17 = read_mean_and_sd(&local_f58,(double *)local_eb0,(double *)local_a68);
          if (bVar17) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Null distribution: mean ",0x18);
            local_10d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)local_eb0;
            poVar19 = std::ostream::_M_insert<double>((double)local_eb0);
            std::__ostream_insert<char,std::char_traits<char>>(poVar19,", sd ",5);
            local_10d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)local_a68;
            poVar19 = std::ostream::_M_insert<double>((double)local_a68);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar19 + -0x18) + (char)poVar19);
            std::ostream::put((char)poVar19);
            std::ostream::flush();
            this_01 = (GaussianEdgeCalculator *)operator_new(0x30);
            GaussianEdgeCalculator::GaussianEdgeCalculator
                      (this_01,0.2,(double)local_10d0,(double)local_10d8);
            local_1040 = (long *)operator_new(0x200);
            std::ofstream::ofstream(local_1040,local_ca8,_S_out);
            goto LAB_00142ffa;
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error reading \"",0xf);
          poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,local_f58._M_dataplus._M_p,
                               local_f58._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar19,"\".",2);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar19 + -0x18) + (char)poVar19);
          std::ostream::put((char)poVar19);
          std::ostream::flush();
          iVar18 = 1;
        }
        pvVar13 = local_fa0;
        if (local_fa0 != (vector<mean_and_stddev_t,_std::allocator<mean_and_stddev_t>_> *)0x0) {
          if (*(void **)local_fa0 != (void *)0x0) {
            operator_delete(*(void **)local_fa0);
          }
          operator_delete(pvVar13);
        }
        std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>::~vector(&local_c68);
        BamTools::SamHeader::~SamHeader((SamHeader *)local_188);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_ef8);
        std::
        _Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable(&local_aa0);
LAB_0014499f:
        std::
        _Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable(&local_7f8);
        std::
        _Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable(&local_7c0);
        if (local_f38 != &local_f28) {
          operator_delete(local_f38);
        }
        if (local_f18 != local_f08) {
          operator_delete(local_f18);
        }
        if (local_ca8 != local_c98) {
          operator_delete(local_ca8);
        }
        if (local_c00 != &local_bf0) {
          operator_delete(local_c00);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f58._M_dataplus._M_p != &local_f58.field_2) {
          operator_delete(local_f58._M_dataplus._M_p);
        }
        if (local_c88 != local_c78) {
          operator_delete(local_c88);
        }
        if (local_1078 != local_1068) {
          operator_delete(local_1078);
        }
        if (local_1100 != local_10f0) {
          operator_delete(local_1100);
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
        ::~_Rb_tree(&local_1038);
        return iVar18;
      }
      goto LAB_00144ad4;
    }
    local_eb0 = (undefined1  [8])&local_ea0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_eb0,"--doc_haplotypes","");
    pmVar21 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                            *)&local_1038,(key_type *)local_eb0);
    docopt::value::throwIfNotKind(pmVar21,String);
    paVar40 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(pmVar21->variant).strList.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    iVar18 = *piVar22;
    *piVar22 = 0;
    lVar23 = strtol(paVar40->_M_local_buf,(char **)local_a68,10);
    if (local_a68 != (undefined1  [8])paVar40) {
      if ((lVar23 - 0x80000000U < 0xffffffff00000000) || (*piVar22 == 0x22)) goto LAB_00144aec;
      if (*piVar22 == 0) {
        *piVar22 = iVar18;
      }
      local_f68 = lVar23;
      if (local_eb0 != (undefined1  [8])&local_ea0) {
        operator_delete((void *)local_eb0);
      }
      goto LAB_001422cc;
    }
  }
  std::__throw_invalid_argument("stoi");
LAB_00144aec:
  uVar36 = std::__throw_out_of_range("stoi");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_10a0.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start != paVar40) {
    operator_delete(local_10a0.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
               *)local_c30);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
               *)&local_ee0);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
               *)local_fd8);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree(&local_1008);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(&local_f98);
  std::ofstream::~ofstream(local_388);
  std::ofstream::~ofstream(local_788);
  std::ofstream::~ofstream(local_588);
  std::ofstream::~ofstream(local_a68);
  std::ofstream::~ofstream(local_eb0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(&local_bb0);
  CliqueCollector::~CliqueCollector(&local_b80);
  if (local_fa0 != (vector<mean_and_stddev_t,_std::allocator<mean_and_stddev_t>_> *)0x0) {
    std::default_delete<std::vector<mean_and_stddev_t,_std::allocator<mean_and_stddev_t>_>_>::
    operator()((default_delete<std::vector<mean_and_stddev_t,_std::allocator<mean_and_stddev_t>_>_>
                *)&local_fa0,local_fa0);
  }
  std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>::~vector(&local_c68);
  BamTools::SamHeader::~SamHeader((SamHeader *)local_188);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_ef8);
  std::
  _Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_aa0);
  std::
  _Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_7f8);
  std::
  _Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_7c0);
  if (local_f38 != &local_f28) {
    operator_delete(local_f38);
  }
  if (local_f18 != local_f08) {
    operator_delete(local_f18);
  }
  if (local_ca8 != local_c98) {
    operator_delete(local_ca8);
  }
  if (local_c00 != &local_bf0) {
    operator_delete(local_c00);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f58._M_dataplus._M_p != &local_f58.field_2) {
    operator_delete(local_f58._M_dataplus._M_p);
  }
  if (local_c88 != local_c78) {
    operator_delete(local_c88);
  }
  if (local_1078 != local_1068) {
    operator_delete(local_1078);
  }
  if (local_1100 != local_10f0) {
    operator_delete(local_1100);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
  ::~_Rb_tree(&local_1038);
  _Unwind_Resume(uVar36);
}

Assistant:

int main(int argc, char* argv[]) {
    cout<<"in main"<<endl;
    map<std::string, docopt::value> args
        = docopt::docopt(USAGE,
                         { argv + 1, argv + argc },
                         false);
    for(auto elem : args)
    {
    cout << elem.first << " " << elem.second << "\n";
    }

    // PARAMETERS
    string bamfile = args["<bamfile>"].asString();
    string outfile = "chromatypes.fasta";
    if (args["<output>"]) outfile = args["<output>"].asString();
    double edge_quasi_cutoff_cliques = 0.99; //stod(args["--edge_quasi_cutoff_cliques"].asString());
    double edge_quasi_cutoff_single = 0.95; //stod(args["--edge_quasi_cutoff_single"].asString());
    double edge_quasi_cutoff_mixed = 0.97; //stod(args["--edge_quasi_cutoff_mixed"].asString());
    double Q = 0.9;//stod(args["--random_overlap_quality"].asString());
    double overlap_cliques = 0.9; //stod(args["--min_overlap_cliques"].asString());
    double overlap_single = 0.6;//stod(args["--min_overlap_single"].asString());
    bool frameshift_merge; // args["--frame_shift_merge"].asBool();
    string allel_frequencies_path = "";
    if (args["--allel_frequencies"]) allel_frequencies_path = args["--allel_frequencies"].asString();
    string mean_and_sd_filename = "";
    if (args["--mean_and_sd_filename"]) mean_and_sd_filename = args["--mean_and_sd_filename"].asString();
    string indel_edge_cutoff;
    double indel_edge_sig_level = 0.2; //stod(args["--indel_edge_sig_level"].asString());
    string indel_output_file = "";
    if (args["--call_indels"]) indel_output_file = args["--call_indels"].asString();
    int iterations = stoi(args["--iterations"].asString());
    double filter = 0.0;// stod(args["--filter"].asString());
    double significance = 3.0; //stod(args["--significance"].asString());
    bool filter_singletons = args["--no_singletons"].asBool();
    string logfile = "";
    if (args["--log"]) logfile = args["--log"].asString();
    int doc_haplotypes = 0;
    if (args["--doc_haplotypes"]) doc_haplotypes = stoi(args["--doc_haplotypes"].asString());
    bool noProb0 = false; //args["--noProb0"].asBool();
    //-ot CHAR --output_type=CHAR
    bool bam = args["--bam"].asBool();
    bool analysisFiles = args["--analysisFiles"].asBool();
    bool nome = args["--nome"].asBool();
    double nomeParam = stod(args["--nomeParam"].asString());
    double uniqueSupportFilter = stod(args["--uniqueSupportFilter"].asString());
    double minOverlap = stod(args["--minOverlap"].asString());
    string reference_path;
    if (args["--ref"]) reference_path = args["--ref"].asString();

    //Read switch rates for both forward and reverse strand
    std::unordered_map<int, double> switchRateFS = readSwitchRateFile(args["--FS"].asString());
    std::unordered_map<int, double> switchRateRS = readSwitchRateFile(args["--RS"].asString());

    // END PARAMETERS

    bool call_indels = indel_output_file.size() > 0;
    if (call_indels && (mean_and_sd_filename.size() == 0)) {
        //cout<<"s1: "<<s1<<endl;
        //cout<<"s2: "<<s2<<endl;
        cerr << "Error: when using option -I, option -M must also be given." << endl;
        return 1;
    }

    //read allel frequency distributions
    std::unordered_map<int, double> simpson_map;
    unsigned int maxPosition2 = 0;
    //cerr << "PARSE PRIOR";
    cerr.flush();
    if (allel_frequencies_path.size() > 0) {
        ifstream ia(allel_frequencies_path.c_str());
        string ia_line;
        while (getline(ia, ia_line)) {
            std::vector<std::string> words;
            trim_right(ia_line);
            boost::split(words, ia_line, boost::is_any_of("\t"), boost::token_compress_on);

            std::vector<std::string> insertion_words;
            boost::split(insertion_words, words[0], boost::is_any_of("\\."), boost::token_compress_on);
            if (insertion_words.size() > 1) {
            } else {
                simpson_map[atoi(words[0].c_str())] = std::log10(pow(atof(words[1].c_str()),2)+pow(atof(words[2].c_str()),2)+pow(atof(words[3].c_str()),2)+pow(atof(words[4].c_str()),2));
                maxPosition2=atoi(words[0].c_str());
                //cerr << simpson_map[atoi(words[0].c_str())] << endl;
            }
        }
        ia.close();
    }
    //cout << "PARSE PRIOR: done" << endl;


    clock_t clock_start = clock();
    vector<string> originalReadNames;
    unsigned int maxPosition1;
    BamTools::SamHeader header;
    BamTools::RefVector references;
    deque<AlignmentRecord*>* reads = readBamFile(bamfile, originalReadNames,maxPosition1,header,references,reference_path);
    EdgeCalculator* edge_calculator = nullptr;
    EdgeCalculator* indel_edge_calculator = nullptr;
    unique_ptr<vector<mean_and_stddev_t> > readgroup_params(nullptr);
    maxPosition1 = (maxPosition1>maxPosition2) ? maxPosition1 : maxPosition2;

    if(nome){
        edge_calculator = new NoMeEdgeCalculator(nomeParam , switchRateFS , switchRateRS);
    }else{
        edge_calculator = new NewEdgeCalculator(Q, edge_quasi_cutoff_cliques, overlap_cliques, frameshift_merge, simpson_map, edge_quasi_cutoff_single, overlap_single, edge_quasi_cutoff_mixed, maxPosition1, noProb0);
    }
    if (call_indels) {
        double insert_mean = -1.0;
        double insert_stddev = -1.0;
        if (!read_mean_and_sd(mean_and_sd_filename, &insert_mean, &insert_stddev)) {
            cerr << "Error reading \"" << mean_and_sd_filename << "\"." << endl;
            return 1;
        }
        cerr << "Null distribution: mean " << insert_mean << ", sd " <<  insert_stddev << endl;
        indel_edge_calculator = new GaussianEdgeCalculator(indel_edge_sig_level,insert_mean,insert_stddev);
    }
    std::ofstream* indel_os = nullptr;
    if (call_indels) {
        indel_os = new ofstream(indel_output_file.c_str());
    }
    LogWriter* lw = nullptr;
    if (logfile != "") lw = new LogWriter(logfile);

    CliqueCollector collector(lw);
    CliqueFinder* clique_finder;

//    if (args["bronkerbosch"].asBool()) {
//        clique_finder = new BronKerbosch(*edge_calculator, collector, lw);
//    } else {
//        clique_finder = new CLEVER(*edge_calculator, collector, lw);
//    }

    clique_finder = new CLEVER(*edge_calculator, collector, lw);
    if (indel_edge_calculator != 0) {
        clique_finder->setSecondEdgeCalculator(indel_edge_calculator);
    }
    ofstream* reads_ofstream = 0;




//    cout<<"befor main loop"<<endl;
    // Main loop
    int ct = 0;
    double stdev = 1.0;
    auto filter_fn = [&](unique_ptr<AlignmentRecord>& read, int size) {

        return (ct == 1 and filter_singletons and read->getReadCount() <= 1) or (ct > 1 and significance != 0.0 and read->getProbability() < 1.0 / size - significance*stdev);
    };
    int edgecounter = 0;
    int nonEdgeCounter = 0;

    cout << "start: " << originalReadNames.size();
    int prevReadsSize = 0;
    int numAllowedGCPos = minOverlap;
    std::map<string,int> appearanceMap;
    while (ct != iterations) {
        if(appearanceMap.size()!=0){
            appearanceMap.clear();
        }
        clique_finder->initialize(&appearanceMap);

        if (lw != nullptr) lw->initialize();
        int size = reads->size();
        prevReadsSize = reads->size();


        while(not reads->empty()) {

            assert(reads->front() != nullptr);

            unique_ptr<AlignmentRecord> al_ptr(reads->front());

            reads->pop_front();
            if (filter_fn(al_ptr,size)) continue;
//            if(ct>0){
//                cout<<al_ptr->getName()<<endl;
//            }
            clique_finder->addAlignment(al_ptr,edgecounter,nonEdgeCounter,numAllowedGCPos,ct);

            //cout << "addAlignment " << ct << endl;

        }
        if(numAllowedGCPos>2){
            numAllowedGCPos--;
        }

        cout << "\tedges: " << edgecounter;
        cout << "\tnonEdges: " << nonEdgeCounter<<endl;


        delete reads;

        clique_finder->finish();
        reads = collector.finish();
        if (lw != nullptr) lw->finish();

        stdev = setProbabilities(*reads);
        if (clique_finder->hasConverged()) break;
        cout << ct++ << ": " << reads->size();
        edgecounter = 0;
        nonEdgeCounter = 0;
    }

    // Filter superreads according to read probability
    if (filter > 0.0) {
        auto filter_fn = [&](AlignmentRecord* al) { return al->getProbability() < filter;};
        auto new_end_it = std::remove_if(reads->begin(), reads->end(), filter_fn);
        for (auto it = new_end_it; it != reads->end(); it++) {
            delete *it;
            *it = nullptr;
        }
        reads->erase(new_end_it, reads->end());
    }
    ofstream os(outfile + ".fasta", std::ofstream::out);
    setProbabilities(*reads);
    //Filter superreads according to unique support information
    if(uniqueSupportFilter > -1){
        ofstream osUniqueError(outfile + "UniqueError" + ".txt",std::ofstream::out);
        ofstream osUniqueTrue(outfile + "UniqueTrue" + ".txt",std::ofstream::out);
        ofstream osSupportError(outfile + "SupportError" + ".txt",std::ofstream::out);
        ofstream osSupportTrue(outfile + "SupportTrue" + ".txt",std::ofstream::out);
        std::map<string,int> readCountMap;
        for (auto it = reads->begin(); it != reads->end(); it++) {
            vector<string> consistingReads = (*it)->getConsistingReads();
            //cout<<(*it)->getName()<<"    "<<endl;
            for(auto s : consistingReads){
                if((s.find("End")==std::string::npos) && (s.find("Clique")==std::string::npos)){
                    string token = s;
                    token.erase(token.begin(), std::find_if(token.begin(), token.end(),
                                std::not1(std::ptr_fun<int, int>(std::isspace))));
                    token.erase(std::find_if(token.rbegin(), token.rend(),
                                std::not1(std::ptr_fun<int, int>(std::isspace))).base(), token.end());
                    if(readCountMap.find(token)!=readCountMap.end()){
                        readCountMap.operator[](token) = readCountMap.operator[](token) + 1;
                    }else{
                        readCountMap.operator[](token) = 1;
                    }
                }
            }
        }


        int errorCount = 0;
        int totalCount = 0;
        int errorWithNoUnique = 0;
        int trueWithNoUnique = 0;

        std::map<int,int> trueReadsSupportMap;
        std::map<int,int> trueReadsUniqueSupportMap;
        std::map<int,int> errorReadsSupportMap;
        std::map<int,int> errorReadsUniqueSupportMap;


        for (auto it = reads->begin(); it != reads->end(); it++) {
            vector<string> consistingReads = (*it)->getConsistingReads();
            //cout<<(*it)->getName()<<"    "<<endl;
            int chroma1 = 0;
            int chroma2 = 0;
            for(auto s : consistingReads){
                if((s.find("End")==std::string::npos) && (s.find("Clique")==std::string::npos)){
                    if(readCountMap[s]>1){
                        (*it)->support += 1;
                    }else if(readCountMap[s]==1){
                        (*it)->uniqueSupport += 1;
                        (*it)->support += 1;
                    }

                    if(s.find("chroma1")!=string::npos) chroma1++;
                    if(s.find("chroma2")!=string::npos) chroma2++;
                }
            }

            if(chroma1!=0 && chroma2!=0){
              errorCount++;
              if((*it)->uniqueSupport==uniqueSupportFilter)errorWithNoUnique++;
              if(errorReadsUniqueSupportMap.find((*it)->uniqueSupport)!=errorReadsUniqueSupportMap.end()){
                  errorReadsUniqueSupportMap[(*it)->uniqueSupport] = errorReadsUniqueSupportMap[(*it)->uniqueSupport] + 1;
              }else{
                  errorReadsUniqueSupportMap[(*it)->uniqueSupport] = 1;
              }
              osUniqueError<<(*it)->uniqueSupport<<endl;
              if(errorReadsSupportMap.find((*it)->support)!=errorReadsSupportMap.end()){
                  errorReadsSupportMap[(*it)->support] = errorReadsSupportMap[(*it)->support] + 1;
              }else{
                  errorReadsSupportMap[(*it)->support] = 1;
              }
              osSupportError<<(*it)->support<<endl;
            }else{
               if((*it)->uniqueSupport==uniqueSupportFilter)trueWithNoUnique++;
               if(trueReadsUniqueSupportMap.find((*it)->uniqueSupport)!=trueReadsUniqueSupportMap.end()){
                   trueReadsUniqueSupportMap[(*it)->uniqueSupport] = trueReadsUniqueSupportMap[(*it)->uniqueSupport] + 1;
               }else{
                   trueReadsUniqueSupportMap[(*it)->uniqueSupport] = 1;
               }
               osUniqueTrue<<(*it)->uniqueSupport<<endl;
               if(trueReadsSupportMap.find((*it)->support)!=trueReadsSupportMap.end()){
                   trueReadsSupportMap[(*it)->support] = trueReadsSupportMap[(*it)->support] + 1;
               }else{
                   trueReadsSupportMap[(*it)->support] = 1;
               }
               osSupportTrue<<(*it)->support<<endl;
            }
            totalCount++;
        }

        osUniqueError.close();
        osSupportError.close();
        osUniqueTrue.close();
        osSupportTrue.close();
        if(!analysisFiles){
            std::remove((outfile + "UniqueError" + ".txt").c_str());
            std::remove((outfile + "UniqueTrue" + ".txt").c_str());
            std::remove((outfile + "SupportError" + ".txt").c_str());
            std::remove((outfile + "SupportTrue" + ".txt").c_str());
        }
    }

    printReads(os, *reads, doc_haplotypes);

    if (bam){
        //cout<<outfile+".bam"<<endl;
//        ofstream os2(outfile + ".bam",std::ofstream::out);
        printBAM(outfile,*reads,header,references,uniqueSupportFilter);
        if(analysisFiles){
            ofstream os3(outfile + "Reads.txt",std::ofstream::out);
            printConsistingReads(os3, *reads,uniqueSupportFilter);
        }
    }


    cout << "final: " << reads->size() << endl;

    for (auto&& r : *reads) {

        delete r;
    }

    delete reads;

    if (indel_os != nullptr) {
        indel_os->close();
        delete indel_os;
    }
    if (edge_calculator != nullptr) delete edge_calculator;
    if (lw != nullptr) delete lw;
    if (clique_finder != nullptr) delete clique_finder;
    if (reads_ofstream != nullptr) {
        delete reads_ofstream;
    }
    cout.precision(3);
    cout << std::fixed;
    double cpu_time = (double) (clock() - clock_start) / CLOCKS_PER_SEC;
    cout << "time: " <<  cpu_time << endl;
    return 0;
}